

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::Data
          (Data<QHashPrivate::Node<QString,_QString>_> *this,
          Data<QHashPrivate::Node<QString,_QString>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  QString *pQVar4;
  long in_RSI;
  Span<QHashPrivate::Node<QString,_QString>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<QString,_QString> *newNode;
  Node<QString,_QString> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<QString,_QString>_> *this_00;
  QString *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  QString *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (((QString *)in_RDI->offsets)->d).ptr = *(char16_t **)(in_RSI + 8);
  (((QString *)in_RDI->offsets)->d).size = 0;
  ((QString *)in_RDI->offsets)[1].d.d = *(Data **)(in_RSI + 0x18);
  ((QString *)in_RDI->offsets)[1].d.ptr = (char16_t *)0x0;
  qMax<unsigned_long>((unsigned_long *)&(((QString *)in_RDI->offsets)->d).ptr,&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  (((QString *)in_RDI->offsets)->d).size = sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  ((QString *)in_RDI->offsets)[1].d.ptr = (char16_t *)RVar5.spans;
  pQVar4 = (QString *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = pQVar4;
  for (local_40 = (QString *)0x0; local_40 < pQVar4;
      local_40 = (QString *)((long)&(local_40->d).d + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<QString,_QString>_>::hasNode
                        ((Span<QHashPrivate::Node<QString,_QString>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<QString,_QString>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<QString>((Data<QHashPrivate::Node<QString,_QString>_> *)RVar5.spans,
                                       key);
        Bucket::insert((Bucket *)0xac3757);
        Node<QString,_QString>::Node
                  ((Node<QString,_QString> *)this_00,(Node<QString,_QString> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }